

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O1

void perlinInit(PerlinNoise *noise,uint64_t *seed)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint8_t uVar9;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  double dVar10;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  double dVar26;
  
  lVar3 = *seed * 0x5deece66d + 0xb;
  uVar4 = lVar3 * 0x5deece66d + 0xb;
  lVar5 = (uVar4 & 0xffffffffffff) * 0x5deece66d + 0xb;
  uVar6 = lVar5 * 0x5deece66d + 0xb;
  uVar7 = uVar6 & 0xffffffffffff;
  *seed = uVar7;
  noise->a = (double)(uVar4 >> 0x15 & 0x7ffffff | lVar3 * 0x20 & 0x1ffffff8000000U) *
             1.1102230246251565e-16 * 256.0;
  noise->b = (double)(uVar6 >> 0x15 & 0x7ffffff | lVar5 * 0x20 & 0x1ffffff8000000U) *
             1.1102230246251565e-16 * 256.0;
  uVar4 = uVar7 * 0x5deece66d + 0xb;
  uVar6 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
  *seed = uVar6;
  noise->c = (double)(uVar6 >> 0x15 | (uVar4 & 0xffffffc00000) << 5) * 1.1102230246251565e-16 *
             256.0;
  noise->amplitude = 1.0;
  noise->lacunarity = 1.0;
  uVar9 = '\0';
  uVar11 = '\x01';
  uVar12 = '\x02';
  uVar13 = '\x03';
  uVar14 = '\x04';
  uVar15 = '\x05';
  uVar16 = '\x06';
  uVar17 = '\a';
  uVar18 = '\b';
  uVar19 = '\t';
  uVar20 = '\n';
  uVar21 = '\v';
  uVar22 = '\f';
  uVar23 = '\r';
  uVar24 = '\x0e';
  uVar25 = '\x0f';
  lVar3 = 0;
  do {
    puVar1 = noise->d + lVar3;
    *puVar1 = uVar9;
    puVar1[1] = uVar11;
    puVar1[2] = uVar12;
    puVar1[3] = uVar13;
    puVar1[4] = uVar14;
    puVar1[5] = uVar15;
    puVar1[6] = uVar16;
    puVar1[7] = uVar17;
    puVar1[8] = uVar18;
    puVar1[9] = uVar19;
    puVar1[10] = uVar20;
    puVar1[0xb] = uVar21;
    puVar1[0xc] = uVar22;
    puVar1[0xd] = uVar23;
    puVar1[0xe] = uVar24;
    puVar1[0xf] = uVar25;
    lVar3 = lVar3 + 0x10;
    uVar9 = uVar9 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
    uVar21 = uVar21 + '\x10';
    uVar22 = uVar22 + '\x10';
    uVar23 = uVar23 + '\x10';
    uVar24 = uVar24 + '\x10';
    uVar25 = uVar25 + '\x10';
  } while (lVar3 != 0x100);
  lVar3 = 0;
  do {
    uVar4 = 0x100 - lVar3;
    uVar8 = *seed;
    if (((uint)uVar4 & (uint)uVar4 - 1) == 0) {
      uVar6 = uVar8 * 0x5deece66d + 0xb & 0xffffffffffff;
      *seed = uVar6;
      iVar2 = (int)((uVar6 >> 0x11) * uVar4 >> 0x1f);
    }
    else {
      do {
        uVar8 = uVar8 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar2 = (int)((uVar8 >> 0x11) % (uVar4 & 0xffffffff));
      } while (-1 < (iVar2 + (int)lVar3 + -0x100) - (int)(uVar8 >> 0x11));
      *seed = uVar8;
    }
    iVar2 = (int)lVar3 + iVar2;
    uVar9 = noise->d[lVar3];
    noise->d[lVar3] = noise->d[iVar2];
    noise->d[iVar2] = uVar9;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  noise->d[0x100] = noise->d[0];
  dVar26 = noise->b;
  dVar10 = floor(dVar26);
  dVar26 = dVar26 - dVar10;
  noise->h2 = (uint8_t)(int)dVar10;
  noise->d2 = dVar26;
  noise->t2 = ((dVar26 * 6.0 + -15.0) * dVar26 + 10.0) * dVar26 * dVar26 * dVar26;
  return;
}

Assistant:

void perlinInit(PerlinNoise *noise, uint64_t *seed)
{
    int i = 0;
    //memset(noise, 0, sizeof(*noise));
    noise->a = nextDouble(seed) * 256.0;
    noise->b = nextDouble(seed) * 256.0;
    noise->c = nextDouble(seed) * 256.0;
    noise->amplitude = 1.0;
    noise->lacunarity = 1.0;

    uint8_t *idx = noise->d;
    for (i = 0; i < 256; i++)
    {
        idx[i] = i;
    }
    for (i = 0; i < 256; i++)
    {
        int j = nextInt(seed, 256 - i) + i;
        uint8_t n = idx[i];
        idx[i] = idx[j];
        idx[j] = n;
    }
    idx[256] = idx[0];
    double i2 = floor(noise->b);
    double d2 = noise->b - i2;
    noise->h2 = (int) i2;
    noise->d2 = d2;
    noise->t2 = d2*d2*d2 * (d2 * (d2*6.0-15.0) + 10.0);
}